

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O3

CURLcode libcurl_generate_mime(CURL *curl,GlobalConfig *config,tool_mime *toolmime,int *mimeno)

{
  CURLcode CVar1;
  int mimeno_00;
  tool_mime *part;
  
  mimeno_00 = (int)mimeno;
  easysrc_mime_count = easysrc_mime_count + 1;
  config->showerror = easysrc_mime_count;
  CVar1 = easysrc_addf(&easysrc_decl,"curl_mime *mime%d;");
  if ((((CVar1 == CURLE_OK) &&
       (CVar1 = easysrc_addf(&easysrc_data,"mime%d = NULL;",(ulong)(uint)config->showerror),
       CVar1 == CURLE_OK)) &&
      (CVar1 = easysrc_addf(&easysrc_code,"mime%d = curl_mime_init(hnd);",
                            (ulong)(uint)config->showerror), CVar1 == CURLE_OK)) &&
     (CVar1 = easysrc_addf(&easysrc_clean,"curl_mime_free(mime%d);",(ulong)(uint)config->showerror),
     CVar1 == CURLE_OK)) {
    CVar1 = easysrc_addf(&easysrc_clean,"mime%d = NULL;",(ulong)(uint)config->showerror);
    if (((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, *(long *)(curl + 0x48) != 0)) &&
       (CVar1 = easysrc_addf(&easysrc_decl,"curl_mimepart *part%d;",(ulong)(uint)config->showerror),
       CVar1 == CURLE_OK)) {
      CVar1 = libcurl_generate_mime_part
                        (*(CURL **)(curl + 0x48),(GlobalConfig *)(ulong)(uint)config->showerror,part
                         ,mimeno_00);
      return CVar1;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode libcurl_generate_mime(CURL *curl,
                                      struct GlobalConfig *config,
                                      struct tool_mime *toolmime,
                                      int *mimeno)
{
  CURLcode ret = CURLE_OK;

  /* May need several mime variables, so invent name. */
  *mimeno = ++easysrc_mime_count;
  DECL1("curl_mime *mime%d;", *mimeno);
  DATA1("mime%d = NULL;", *mimeno);
  CODE1("mime%d = curl_mime_init(hnd);", *mimeno);
  CLEAN1("curl_mime_free(mime%d);", *mimeno);
  CLEAN1("mime%d = NULL;", *mimeno);

  if(toolmime->subparts) {
    DECL1("curl_mimepart *part%d;", *mimeno);
    ret = libcurl_generate_mime_part(curl, config,
                                     toolmime->subparts, *mimeno);
  }

nomem:
  return ret;
}